

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O2

void __thiscall dh::token::token(token *this,token *other)

{
  int iVar1;
  
  (this->_val)._M_dataplus._M_p = (pointer)&(this->_val).field_2;
  (this->_val)._M_string_length = 0;
  (this->_val).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  iVar1 = other->_lineno;
  this->_type = other->_type;
  this->_lineno = iVar1;
  return;
}

Assistant:

token::token( const token& other)
{
	this->_val = other._val;
	this->_type = other._type;
	this->_lineno = other._lineno;
}